

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O0

UDataMemory *
doLoadFromIndividualFiles
          (char *pkgName,char *dataPath,char *tocEntryPathSuffix,char *path,char *type,char *name,
          UDataMemoryIsAcceptable *isAcceptable,void *context,UErrorCode *subErrorCode,
          UErrorCode *pErrorCode)

{
  UBool UVar1;
  undefined1 local_180 [8];
  UDataPathIterator iter;
  UDataMemory *pEntryData;
  UDataMemory dataMemory;
  char *pathBuffer;
  char *name_local;
  char *type_local;
  char *path_local;
  char *tocEntryPathSuffix_local;
  char *dataPath_local;
  char *pkgName_local;
  
  icu_63::UDataPathIterator::UDataPathIterator
            ((UDataPathIterator *)local_180,dataPath,pkgName,path,tocEntryPathSuffix,'\0',pErrorCode
            );
  do {
    do {
      dataMemory._48_8_ = icu_63::UDataPathIterator::next((UDataPathIterator *)local_180,pErrorCode)
      ;
      if ((char *)dataMemory._48_8_ == (char *)0x0) {
        pkgName_local = (char *)0x0;
LAB_003a374c:
        icu_63::UDataPathIterator::~UDataPathIterator((UDataPathIterator *)local_180);
        return (UDataMemory *)pkgName_local;
      }
      UVar1 = uprv_mapFile_63((UDataMemory *)&pEntryData,(char *)dataMemory._48_8_,pErrorCode);
    } while (UVar1 == '\0');
    iter._240_8_ = checkDataItem((DataHeader *)dataMemory.vFuncs,isAcceptable,context,type,name,
                                 subErrorCode,pErrorCode);
    if ((UDataMemory *)iter._240_8_ != (UDataMemory *)0x0) {
      ((UDataMemory *)iter._240_8_)->mapAddr = (void *)dataMemory._24_8_;
      ((UDataMemory *)iter._240_8_)->map = dataMemory.mapAddr;
      pkgName_local = (char *)iter._240_8_;
      goto LAB_003a374c;
    }
    udata_close_63((UDataMemory *)&pEntryData);
    UVar1 = U_FAILURE(*pErrorCode);
    if (UVar1 != '\0') {
      pkgName_local = (char *)0x0;
      goto LAB_003a374c;
    }
    *subErrorCode = U_INVALID_FORMAT_ERROR;
  } while( true );
}

Assistant:

static UDataMemory *doLoadFromIndividualFiles(const char *pkgName, 
        const char *dataPath, const char *tocEntryPathSuffix,
            /* following arguments are the same as doOpenChoice itself */
            const char *path, const char *type, const char *name,
             UDataMemoryIsAcceptable *isAcceptable, void *context,
             UErrorCode *subErrorCode,
             UErrorCode *pErrorCode)
{
    const char         *pathBuffer;
    UDataMemory         dataMemory;
    UDataMemory *pEntryData;

    /* look in ind. files: package\nam.typ  ========================= */
    /* init path iterator for individual files */
    UDataPathIterator iter(dataPath, pkgName, path, tocEntryPathSuffix, FALSE, pErrorCode);

    while ((pathBuffer = iter.next(pErrorCode)) != NULL)
    {
#ifdef UDATA_DEBUG
        fprintf(stderr, "UDATA: trying individual file %s\n", pathBuffer);
#endif
        if (uprv_mapFile(&dataMemory, pathBuffer, pErrorCode))
        {
            pEntryData = checkDataItem(dataMemory.pHeader, isAcceptable, context, type, name, subErrorCode, pErrorCode);
            if (pEntryData != NULL) {
                /* Data is good.
                *  Hand off ownership of the backing memory to the user's UDataMemory.
                *  and return it.   */
                pEntryData->mapAddr = dataMemory.mapAddr;
                pEntryData->map     = dataMemory.map;

#ifdef UDATA_DEBUG
                fprintf(stderr, "** Mapped file: %s\n", pathBuffer);
#endif
                return pEntryData;
            }

            /* the data is not acceptable, or some error occurred.  Either way, unmap the memory */
            udata_close(&dataMemory);

            /* If we had a nasty error, bail out completely.  */
            if (U_FAILURE(*pErrorCode)) {
                return NULL;
            }

            /* Otherwise remember that we found data but didn't like it for some reason  */
            *subErrorCode=U_INVALID_FORMAT_ERROR;
        }
#ifdef UDATA_DEBUG
        fprintf(stderr, "%s\n", UDataMemory_isLoaded(&dataMemory)?"LOADED":"not loaded");
#endif
    }
    return NULL;
}